

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

char * __thiscall Json::Value::asCString(Value *this)

{
  char *pcVar1;
  OStringStream oss;
  String local_1a0;
  ostringstream local_180 [376];
  
  if ((char)*(ushort *)&this->bits_ == '\x04') {
    pcVar1 = (this->value_).string_ + (*(ushort *)&this->bits_ >> 6 & 4);
    if ((this->value_).string_ == (char *)0x0) {
      pcVar1 = (char *)0x0;
    }
    return pcVar1;
  }
  std::__cxx11::ostringstream::ostringstream(local_180);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_180,"in Json::Value::asCString(): requires stringValue",0x31);
  std::__cxx11::stringbuf::str();
  throwLogicError(&local_1a0);
}

Assistant:

ValueType Value::type() const {
  return static_cast<ValueType>(bits_.value_type_);
}